

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

float lodepng::iccForwardTRC(LodePNGICCCurve *curve,float x)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  switch(curve->type) {
  case 0:
    break;
  case 1:
    pfVar1 = curve->lut;
    if (pfVar1 == (float *)0x0) {
      return 0.0;
    }
    if (0.0 <= x) {
      uVar2 = curve->lut_size;
      fVar5 = (float)(uVar2 - 1) * x;
      uVar3 = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
      if (uVar3 < uVar2) {
        if (uVar3 + 1 < uVar2) {
          fVar4 = pfVar1[uVar3 + 1];
        }
        else {
          fVar4 = 1.0;
        }
        return (fVar5 - (float)uVar3) * fVar4 + pfVar1[uVar3] * (1.0 - (fVar5 - (float)uVar3));
      }
      return x;
    }
    break;
  case 2:
    if (0.0 < x) {
LAB_0011b18c:
      fVar5 = lodepng_powf(x,curve->gamma);
      return fVar5;
    }
    break;
  case 3:
    if (0.0 <= x) {
      if (x < -curve->b / curve->a) {
        return 0.0;
      }
      fVar4 = curve->a * x + curve->b;
      fVar5 = curve->gamma;
      goto LAB_0011b1b8;
    }
    break;
  case 4:
    if (0.0 <= x) {
      if (x < -curve->b / curve->a) {
        return curve->c;
      }
      fVar4 = curve->a * x + curve->b;
      fVar5 = curve->gamma;
      goto LAB_0011b1b8;
    }
    break;
  case 5:
    if (curve->d <= x) {
      x = x * curve->a + curve->b;
      goto LAB_0011b18c;
    }
    x = x * curve->c;
    break;
  case 6:
    if (x < curve->d) {
      return x * curve->c + curve->f;
    }
    fVar4 = x * curve->a + curve->b;
    fVar5 = curve->gamma;
LAB_0011b1b8:
    fVar5 = lodepng_powf(fVar4,fVar5);
    return fVar5 + curve->c;
  default:
    return 0.0;
  }
  return x;
}

Assistant:

static float iccForwardTRC(const LodePNGICCCurve* curve, float x) {
  if(curve->type == 0) {
    return x;
  }
  if(curve->type == 1) { /* Lookup table */
    float v0, v1, fraction;
    size_t index;
    if(!curve->lut) return 0; /* error */
    if(x < 0) return x;
    index = (size_t)(x * (curve->lut_size - 1));
    if(index >= curve->lut_size) return x;

    /* LERP */
    v0 = curve->lut[index];
    v1 = (index + 1 < curve->lut_size) ? curve->lut[index + 1] : 1.0f;
    fraction = (x * (curve->lut_size - 1)) - index;
    return v0 * (1 - fraction) + v1 * fraction;
  }
  if(curve->type == 2) {
    /* Gamma expansion */
    return (x > 0) ? lodepng_powf(x, curve->gamma) : x;
  }
  /* TODO: all the ones below are untested */
  if(curve->type == 3) {
    if(x < 0) return x;
    return x >= (-curve->b / curve->a) ? (lodepng_powf(curve->a * x + curve->b, curve->gamma) + curve->c) : 0;
  }
  if(curve->type == 4) {
    if(x < 0) return x;
    return x >= (-curve->b / curve->a) ? (lodepng_powf(curve->a * x + curve->b, curve->gamma) + curve->c) : curve->c;
  }
  if(curve->type == 5) {
    return x >= curve->d ? (lodepng_powf(curve->a * x + curve->b, curve->gamma)) : (curve->c * x);
  }
  if(curve->type == 6) {
    return x >= curve->d ? (lodepng_powf(curve->a * x + curve->b, curve->gamma) + curve->c) : (curve->c * x + curve->f);
  }
  return 0;
}